

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O1

int deletePointAtIndex(DelaunayTriangulation *delTri,GLsizei i_p)

{
  int iVar1;
  GLfloat (*paGVar2) [2];
  GLfloat (*paGVar3) [2];
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  iVar1 = delTri->n_points;
  if ((long)iVar1 != 0) {
    iVar6 = iVar1 + -1;
    delTri->n_points = iVar6;
    paGVar3 = (GLfloat (*) [2])malloc((long)iVar1 * 8 - 8);
    if (0 < i_p) {
      paGVar2 = delTri->points;
      uVar4 = 0;
      do {
        paGVar3[uVar4][0] = paGVar2[uVar4][0];
        paGVar3[uVar4][1] = paGVar2[uVar4][1];
        uVar4 = uVar4 + 1;
      } while ((uint)i_p != uVar4);
    }
    if (i_p < iVar6) {
      paGVar2 = delTri->points;
      lVar5 = (long)i_p;
      do {
        paGVar3[lVar5][0] = paGVar2[lVar5 + 1][0];
        paGVar3[lVar5][1] = paGVar2[lVar5 + 1][1];
        lVar5 = lVar5 + 1;
      } while (iVar6 != lVar5);
    }
    free(delTri->points);
    delTri->points = paGVar3;
    resetDelaunayTriangulation(delTri);
    return 1;
  }
  return 0;
}

Assistant:

int deletePointAtIndex(DelaunayTriangulation *delTri, GLsizei i_p) {
	if (delTri->n_points == 0) {
		return 0;
	}

	delTri->n_points -= 1;
	GLfloat (*points)[2] = malloc(sizeof(delTri->points[0]) * delTri->n_points);

	for (GLsizei i = 0; i < i_p; i++) {
		points[i][0] = delTri->points[i][0];
		points[i][1] = delTri->points[i][1];
	}
	for (GLsizei i = i_p; i < delTri->n_points; i++) {
		points[i][0] = delTri->points[i + 1][0];
		points[i][1] = delTri->points[i + 1][1];
	}

	free(delTri->points);
	delTri->points = points;

	resetDelaunayTriangulation(delTri);
	return 1;
}